

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_logic(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 pTVar1;
  bool bVar2;
  
  if ((rd != 0) && (opc - 0x24 < 4)) {
    tcg_ctx = ctx->uc->tcg_ctx;
    switch(opc) {
    case 0x24:
      if ((rs != 0) && (rt != 0)) {
        tcg_gen_op3_mips64el
                  (tcg_ctx,INDEX_op_and_i64,
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rd]),
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rs]),
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rt]));
        return;
      }
      gen_logic_cold_1();
      return;
    case 0x25:
      if ((rs != 0) && (rt != 0)) {
        tcg_gen_op3_mips64el
                  (tcg_ctx,INDEX_op_or_i64,
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rd]),
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rs]),
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rt]));
        return;
      }
      break;
    case 0x26:
      if ((rs != 0) && (rt != 0)) {
        tcg_gen_op3_mips64el
                  (tcg_ctx,INDEX_op_xor_i64,
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rd]),
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rs]),
                   (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rt]));
        return;
      }
      break;
    case 0x27:
      if (rt != 0 && rs != 0) {
        tcg_gen_nor_i64_mips64el
                  (tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rs],tcg_ctx->cpu_gpr[rt]);
        return;
      }
      if (rs == 0 && rt != 0) {
        tcg_gen_not_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rt]);
        return;
      }
      if (rt == 0 && rs != 0) {
        tcg_gen_not_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[rd],tcg_ctx->cpu_gpr[rs]);
        return;
      }
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_gpr[rd] + (long)tcg_ctx),
                 0xffffffffffffffff);
      return;
    }
    if (rs == 0 && rt != 0) {
      pTVar1 = tcg_ctx->cpu_gpr[rd];
    }
    else {
      bVar2 = rt != 0;
      pTVar1 = tcg_ctx->cpu_gpr[rd];
      rt = rs;
      if (bVar2 || rs == 0) {
        tcg_gen_op2_mips64el
                  (tcg_ctx,INDEX_op_movi_i64,(TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar1),0);
        return;
      }
    }
    if (pTVar1 != tcg_ctx->cpu_gpr[rt]) {
      tcg_gen_op2_mips64el
                (tcg_ctx,INDEX_op_mov_i64,(TCGArg)((long)&tcg_ctx->pool_cur + (long)pTVar1),
                 (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_gpr[rt]));
      return;
    }
  }
  return;
}

Assistant:

static void gen_logic(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    switch (opc) {
    case OPC_AND:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_and_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_NOR:
        if (rs != 0 && rt != 0) {
            tcg_gen_nor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], ~((target_ulong)0));
        }
        break;
    case OPC_OR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_XOR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    }
}